

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::VersionSet::Finalize(VersionSet *this,Version *v)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int level;
  ulong uVar8;
  long in_FS_OFFSET;
  double result;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = -1;
  uVar8 = 0;
  dVar11 = -1.0;
  do {
    if (uVar8 == 0) {
      lVar4 = (long)v->files_[0].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)v->files_[0].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar4 >> 3;
      auVar10._8_4_ = (int)(lVar4 >> 0x23);
      auVar10._0_8_ = lVar5;
      auVar10._12_4_ = 0x45300000;
      dVar9 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 0.25;
      iVar2 = 0;
    }
    else {
      if (uVar8 == 6) {
        v->compaction_level_ = iVar7;
        v->compaction_score_ = dVar11;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
        __stack_chk_fail();
      }
      iVar3 = TotalFileSize(v->files_ + uVar8);
      dVar9 = 10485760.0;
      for (uVar6 = uVar8 & 0xffffffff; 1 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
        dVar9 = dVar9 * 10.0;
      }
      auVar12._8_4_ = (int)((ulong)iVar3 >> 0x20);
      auVar12._0_8_ = iVar3;
      auVar12._12_4_ = 0x45300000;
      dVar9 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)iVar3) - 4503599627370496.0)) / dVar9;
      iVar2 = (int)uVar8;
    }
    if (dVar9 <= dVar11) {
      dVar9 = dVar11;
      iVar2 = iVar7;
    }
    iVar7 = iVar2;
    uVar8 = uVar8 + 1;
    dVar11 = dVar9;
  } while( true );
}

Assistant:

void VersionSet::Finalize(Version* v) {
  // Precomputed best level for next compaction
  int best_level = -1;
  double best_score = -1;

  for (int level = 0; level < config::kNumLevels - 1; level++) {
    double score;
    if (level == 0) {
      // We treat level-0 specially by bounding the number of files
      // instead of number of bytes for two reasons:
      //
      // (1) With larger write-buffer sizes, it is nice not to do too
      // many level-0 compactions.
      //
      // (2) The files in level-0 are merged on every read and
      // therefore we wish to avoid too many files when the individual
      // file size is small (perhaps because of a small write-buffer
      // setting, or very high compression ratios, or lots of
      // overwrites/deletions).
      score = v->files_[level].size() /
              static_cast<double>(config::kL0_CompactionTrigger);
    } else {
      // Compute the ratio of current size to size limit.
      const uint64_t level_bytes = TotalFileSize(v->files_[level]);
      score =
          static_cast<double>(level_bytes) / MaxBytesForLevel(options_, level);
    }

    if (score > best_score) {
      best_level = level;
      best_score = score;
    }
  }

  v->compaction_level_ = best_level;
  v->compaction_score_ = best_score;
}